

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

void lose_weapon_skill(int n)

{
  char cVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  
  do {
    if (n < 1) {
      return;
    }
    if (u.weapon_slots == 0) {
      lVar3 = (long)u.skills_advanced;
      if (lVar3 != 0) {
        u.skills_advanced = u.skills_advanced + -1;
        cVar1 = u.skill_record[lVar3 + -1];
        uVar4 = (ulong)cVar1;
        cVar2 = u.weapon_skills[uVar4].skill;
        if (cVar2 < '\x02') {
          panic("lose_weapon_skill (%d)",uVar4 & 0xffffffff);
        }
        u.weapon_skills[uVar4].skill = cVar2 + -1;
        u.weapon_slots = slots_required((int)cVar1);
        goto LAB_00270d3c;
      }
    }
    else {
LAB_00270d3c:
      u.weapon_slots = u.weapon_slots + -1;
    }
    n = n + -1;
  } while( true );
}

Assistant:

void lose_weapon_skill(int n)
{
    int skill;

    while (--n >= 0) {
	/* deduct first from unused slots, then from last placed slot, if any */
	if (u.weapon_slots) {
	    u.weapon_slots--;
	} else if (u.skills_advanced) {
	    skill = u.skill_record[--u.skills_advanced];
	    if (P_SKILL(skill) <= P_UNSKILLED)
		panic("lose_weapon_skill (%d)", skill);
	    P_SKILL(skill)--;	/* drop skill one level */
	    /* Lost skill might have taken more than one slot; refund rest. */
	    u.weapon_slots = slots_required(skill) - 1;
	    /* It might now be possible to advance some other pending
	       skill by using the refunded slots, but giving a message
	       to that effect would seem pretty confusing.... */
	}
    }
}